

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmTable.c
# Opt level: O1

int Nm_ManTableDelete(Nm_Man_t *p,int ObjId)

{
  uint uVar1;
  Nm_Entry_t *pNVar2;
  Nm_Entry_t *pNVar3;
  Nm_Entry_t *pNVar4;
  Nm_Entry_t **ppNVar5;
  uint uVar6;
  int iVar7;
  Nm_Entry_t *pNVar8;
  Nm_Entry_t **ppNVar9;
  Nm_Entry_t *pNVar10;
  ulong uVar11;
  char cVar12;
  uint uVar13;
  
  p->nEntries = p->nEntries + -1;
  pNVar8 = Nm_ManTableLookupId(p,ObjId);
  if (pNVar8 == (Nm_Entry_t *)0x0) {
    __assert_fail("Nm_ManTableLookupId(p, ObjId) != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                  ,0x76,"int Nm_ManTableDelete(Nm_Man_t *, int)");
  }
  uVar1 = p->nBins;
  ppNVar5 = p->pBinsI2N +
            (ulong)(((uint)ObjId >> 0x18) * 0x161 ^ (ObjId & 0xffU) * 0x1f01 ^
                   ((uint)ObjId >> 0x10 & 0xff) * 0x38f ^ ((uint)ObjId >> 8 & 0xff) * 0xb9b) %
            (ulong)uVar1;
  do {
    ppNVar9 = ppNVar5;
    pNVar8 = *ppNVar9;
    ppNVar5 = &pNVar8->pNextI2N;
  } while (pNVar8->ObjId != ObjId);
  *ppNVar9 = pNVar8->pNextI2N;
  cVar12 = (char)pNVar8[1].Type;
  uVar6 = 0;
  if (cVar12 != '\0') {
    uVar11 = 1;
    uVar13 = 0;
    do {
      uVar6 = uVar6 ^ (int)cVar12 * (int)cVar12 *
                      (&Nm_HashString_s_Primes)[~((uVar13 / 10) * 10) + (int)uVar11];
      uVar13 = uVar13 + 1;
      cVar12 = *(char *)((long)&pNVar8[1].Type + uVar11);
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (cVar12 != '\0');
  }
  ppNVar5 = p->pBinsN2I + (ulong)uVar6 % (ulong)uVar1;
  do {
    ppNVar9 = ppNVar5;
    pNVar2 = *ppNVar9;
    if (pNVar2 == (Nm_Entry_t *)0x0) break;
    ppNVar5 = &pNVar2->pNextN2I;
  } while (pNVar2 != pNVar8);
  if (pNVar2 != (Nm_Entry_t *)0x0) {
    if (pNVar2 != pNVar8) {
      __assert_fail("*ppSpot == pEntry",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                    ,0x84,"int Nm_ManTableDelete(Nm_Man_t *, int)");
    }
    *ppNVar9 = pNVar2->pNextN2I;
  }
  pNVar3 = pNVar8->pNameSake;
  if (pNVar3 == (Nm_Entry_t *)0x0) {
    if (pNVar2 == (Nm_Entry_t *)0x0) {
      __assert_fail("fRemoved",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                    ,0x8a,"int Nm_ManTableDelete(Nm_Man_t *, int)");
    }
  }
  else {
    pNVar4 = pNVar8;
    if (pNVar3 == pNVar8) {
      __assert_fail("pEntry->pNameSake != pEntry",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                    ,0x8e,"int Nm_ManTableDelete(Nm_Man_t *, int)");
    }
    do {
      pNVar10 = pNVar4;
      pNVar4 = pNVar10->pNameSake;
    } while (pNVar10->pNameSake != pNVar8);
    iVar7 = strcmp((char *)(pNVar10 + 1),(char *)(pNVar8 + 1));
    if (iVar7 != 0) {
      __assert_fail("!strcmp(pPrev->Name, pEntry->Name)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                    ,0x90,"int Nm_ManTableDelete(Nm_Man_t *, int)");
    }
    pNVar8 = (Nm_Entry_t *)0x0;
    if (pNVar3 != pNVar10) {
      pNVar8 = pNVar3;
    }
    pNVar10->pNameSake = pNVar8;
    if (pNVar2 != (Nm_Entry_t *)0x0) {
      if (pNVar10->pNextN2I != (Nm_Entry_t *)0x0) {
        __assert_fail("pPrev->pNextN2I == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/nm/nmTable.c"
                      ,0x99,"int Nm_ManTableDelete(Nm_Man_t *, int)");
      }
      pNVar10->pNextN2I = *ppNVar9;
      *ppNVar9 = pNVar10;
    }
  }
  return 1;
}

Assistant:

int Nm_ManTableDelete( Nm_Man_t * p, int ObjId )
{
    Nm_Entry_t ** ppSpot, * pEntry, * pPrev;
    int fRemoved;
    p->nEntries--;
    // remove the entry from the table Id->Name
    assert( Nm_ManTableLookupId(p, ObjId) != NULL );
    ppSpot = p->pBinsI2N + Nm_HashNumber(ObjId, p->nBins);
    while ( (*ppSpot)->ObjId != (unsigned)ObjId )
        ppSpot = &(*ppSpot)->pNextI2N;
    pEntry = *ppSpot; 
    *ppSpot = (*ppSpot)->pNextI2N;
    // remove the entry from the table Name->Id
    ppSpot = p->pBinsN2I + Nm_HashString(pEntry->Name, p->nBins);
    while ( *ppSpot && *ppSpot != pEntry )
        ppSpot = &(*ppSpot)->pNextN2I;
    // remember if we found this one in the list
    fRemoved = (*ppSpot != NULL);
    if ( *ppSpot )
    {
        assert( *ppSpot == pEntry );
        *ppSpot = (*ppSpot)->pNextN2I;
    }
    // quit if this entry has no namesakes
    if ( pEntry->pNameSake == NULL )
    {
        assert( fRemoved );
        return 1;
    }
    // remove entry from the ring of namesakes
    assert( pEntry->pNameSake != pEntry );
    for ( pPrev = pEntry; pPrev->pNameSake != pEntry; pPrev = pPrev->pNameSake );
    assert( !strcmp(pPrev->Name, pEntry->Name) );
    assert( pPrev->pNameSake == pEntry );
    if ( pEntry->pNameSake == pPrev ) // two entries in the ring
        pPrev->pNameSake = NULL;
    else
        pPrev->pNameSake = pEntry->pNameSake;
    // reinsert the ring back if we removed its connection with the list in the table
    if ( fRemoved )
    {
        assert( pPrev->pNextN2I == NULL );
        pPrev->pNextN2I = *ppSpot;
        *ppSpot = pPrev;
    }
    return 1;
}